

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall
socketsys::UnixServerProvider::bind
          (UnixServerProvider *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  pointer pvVar2;
  const_pointer __name;
  NameResolveException *this_00;
  SocketBindException *this_01;
  int *piVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  int __fd_00;
  int local_8c;
  addrinfo *paStack_88;
  int result;
  addrinfo *res;
  addrinfo hints;
  int local_48;
  socklen_t length;
  int type;
  socklen_t size;
  sockaddr data;
  array<char,_6UL> portBuffer;
  size_t backlog_local;
  uint16_t port_local;
  string_view *address_local;
  SocketHandle handle_local;
  
  register0x00000008 = CONCAT44(in_register_0000000c,__len);
  __fd_00 = (int)this;
  memset(data.sa_data + 6,0,6);
  pvVar2 = std::array<char,_6UL>::data((array<char,_6UL> *)(data.sa_data + 6));
  sprintf(pvVar2,"%d",(ulong)__addr & 0xffff);
  memset((void *)((long)&type + 2),0,0x10);
  length = 0x10;
  getsockname(__fd_00,(sockaddr *)((long)&type + 2),&length);
  hints.ai_next._4_4_ = 4;
  getsockopt(__fd_00,1,3,&local_48,(socklen_t *)((long)&hints.ai_next + 4));
  memset(&res,0,0x30);
  res._0_4_ = 0;
  res._4_4_ = (uint)type._2_2_;
  hints.ai_flags = local_48;
  hints.ai_family = 0x11;
  if (local_48 == 1) {
    hints.ai_family = 6;
  }
  __name = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT44(in_register_00000034,__fd));
  pvVar2 = std::array<char,_6UL>::data((array<char,_6UL> *)(data.sa_data + 6));
  iVar1 = getaddrinfo(__name,pvVar2,(addrinfo *)&res,&stack0xffffffffffffff78);
  if (iVar1 != 0) {
    this_00 = (NameResolveException *)__cxa_allocate_exception(0x10);
    NameResolveException::NameResolveException(this_00,"Linux failed to resolve address ",iVar1);
    __cxa_throw(this_00,&NameResolveException::typeinfo,NameResolveException::~NameResolveException)
    ;
  }
  local_8c = ::bind(__fd_00,paStack_88->ai_addr,paStack_88->ai_addrlen);
  freeaddrinfo(paStack_88);
  iVar1 = extraout_EAX;
  if (local_8c != -1) {
    iVar1 = listen(__fd_00,(int)stack0xffffffffffffffd8);
    local_8c = iVar1;
  }
  if (local_8c == -1) {
    this_01 = (SocketBindException *)__cxa_allocate_exception(0x10);
    piVar3 = __errno_location();
    SocketBindException::SocketBindException(this_01,"Linux failed to bind server socket ",*piVar3);
    __cxa_throw(this_01,&SocketBindException::typeinfo,SocketBindException::~SocketBindException);
  }
  return iVar1;
}

Assistant:

void UnixServerProvider::bind(SocketHandle handle, const std::string_view& address, uint16_t port, size_t backlog) {
    std::array<char, 6> portBuffer{};
    sprintf(portBuffer.data(),"%d", port);

    sockaddr data{};
    socklen_t size = sizeof(sockaddr);
    getsockname(handle, &data, &size);

    int type;
    socklen_t length = sizeof(int);
    getsockopt(handle, SOL_SOCKET, SO_TYPE, &type, &length);

    addrinfo hints {
            {},
            data.sa_family,
            type,
            type == SOCK_STREAM ? IPPROTO_TCP : IPPROTO_UDP,
    };

    addrinfo* res;
    auto result = getaddrinfo(address.data(), portBuffer.data(), &hints, &res);
    if (result != 0) {
        throw NameResolveException("Linux failed to resolve address ", result);
    }

    result = ::bind(handle, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);

    if (result != -1) result = listen(handle, static_cast<int>(backlog));
    if (result == -1) {
        throw SocketBindException("Linux failed to bind server socket ", errno);
    }
}